

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::TypedModeFunction<duckdb::ModeStandard<int>>::
     ConstantOperation<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
               (ModeState<int,_duckdb::ModeStandard<int>_> *state,int *key,
               AggregateUnaryInput *aggr_input,idx_t count)

{
  ulong uVar1;
  _Map_base<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this;
  mapped_type *pmVar2;
  ulong uVar3;
  
  this = (_Map_base<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)state->frequency_map;
  if (this == (_Map_base<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)0x0) {
    this = (_Map_base<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)ModeStandard<int>::CreateEmpty(aggr_input->input->allocator);
    state->frequency_map = (Counts *)this;
  }
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this,key);
  pmVar2->count = pmVar2->count + count;
  uVar1 = state->count;
  uVar3 = pmVar2->first_row;
  if (uVar1 <= pmVar2->first_row) {
    uVar3 = uVar1;
  }
  pmVar2->first_row = uVar3;
  state->count = uVar1 + count;
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &key, AggregateUnaryInput &aggr_input, idx_t count) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(aggr_input.input.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		i.count += count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		state.count += count;
	}